

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O0

bool __thiscall LinearGE<0,_0>::propagate(LinearGE<0,_0> *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int64_t iVar4;
  Lit *pLVar5;
  Lit *pLVar6;
  Clause *pCVar7;
  long in_RDI;
  uint j_3;
  uint j_2;
  Reason expl_1;
  int64_t v_1;
  uint i_3;
  uint j_1;
  uint j;
  Reason expl;
  int64_t v;
  uint i_2;
  uint i_1;
  uint i;
  int64_t max_sum;
  vec<Lit> *in_stack_ffffffffffffff08;
  vec<Lit> *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  uint in_stack_ffffffffffffff1c;
  anon_union_8_2_743a5d44_for_Reason_0 in_stack_ffffffffffffff20;
  anon_union_8_2_743a5d44_for_Reason_0 local_88;
  int local_80;
  uint local_7c;
  int local_78;
  uint local_74;
  anon_union_8_2_743a5d44_for_Reason_0 local_70;
  long local_68;
  uint local_5c;
  anon_union_8_2_743a5d44_for_Reason_0 local_58;
  anon_union_8_2_743a5d44_for_Reason_0 local_50;
  int local_48;
  uint local_44;
  int local_40;
  uint local_3c;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  long local_30;
  uint local_24;
  uint local_20;
  uint local_1c;
  long local_18;
  
  local_18 = *(long *)(in_RDI + 0x70);
  for (local_1c = *(uint *)(in_RDI + 100); uVar3 = local_1c,
      uVar2 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28)), uVar3 < uVar2;
      local_1c = local_1c + 1) {
    vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_1c);
    iVar4 = IntView<0>::getMax((IntView<0> *)in_stack_ffffffffffffff10);
    local_18 = iVar4 + local_18;
  }
  for (local_20 = *(uint *)(in_RDI + 0x68); uVar3 = local_20,
      uVar2 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38)), uVar3 < uVar2;
      local_20 = local_20 + 1) {
    vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_20);
    iVar4 = IntView<1>::getMax((IntView<1> *)in_stack_ffffffffffffff10);
    local_18 = iVar4 + local_18;
  }
  for (local_24 = *(uint *)(in_RDI + 100); uVar3 = local_24,
      uVar2 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28)), uVar3 < uVar2;
      local_24 = local_24 + 1) {
    vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_24);
    iVar4 = IntView<0>::getMax((IntView<0> *)in_stack_ffffffffffffff10);
    local_30 = iVar4 - local_18;
    vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_24);
    bVar1 = IntView<0>::setMinNotR
                      ((IntView<0> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
    if (bVar1) {
      Reason::Reason((Reason *)&local_38);
      if ((so.lazy & 1U) != 0) {
        for (local_3c = 0; uVar3 = local_3c,
            uVar2 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28)), uVar3 < uVar2;
            local_3c = local_3c + 1) {
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_3c);
          local_40 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_ffffffffffffff08);
          pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_3c);
          pLVar5->x = local_40;
        }
        for (local_44 = 0; uVar3 = local_44,
            uVar2 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38)), uVar3 < uVar2;
            local_44 = local_44 + 1) {
          vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_44);
          local_48 = (int)IntView<1>::getMaxLit((IntView<1> *)in_stack_ffffffffffffff08);
          uVar3 = local_44;
          uVar2 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
          pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),uVar3 + uVar2);
          pLVar5->x = local_48;
        }
        pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
        pLVar6 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_24);
        pLVar6->x = pLVar5->x;
        pCVar7 = Reason_new<vec<Lit>>(in_stack_ffffffffffffff10);
        Reason::Reason((Reason *)&local_50,pCVar7);
        local_38 = local_50;
      }
      vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_24);
      local_58 = local_38;
      bVar1 = IntView<0>::setMin((IntView<0> *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 (int64_t)in_stack_ffffffffffffff10,
                                 (Reason)in_stack_ffffffffffffff20,
                                 SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
  }
  local_5c = *(uint *)(in_RDI + 0x68);
  do {
    uVar3 = local_5c;
    uVar2 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38));
    if (uVar2 <= uVar3) {
      return true;
    }
    vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_5c);
    iVar4 = IntView<1>::getMax((IntView<1> *)in_stack_ffffffffffffff10);
    local_68 = iVar4 - local_18;
    vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_5c);
    bVar1 = IntView<1>::setMinNotR
                      ((IntView<1> *)in_stack_ffffffffffffff10,(int64_t)in_stack_ffffffffffffff08);
    if (bVar1) {
      Reason::Reason((Reason *)&local_70);
      if ((so.lazy & 1U) != 0) {
        for (local_74 = 0; uVar3 = local_74,
            uVar2 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28)), uVar3 < uVar2;
            local_74 = local_74 + 1) {
          vec<IntView<0>_>::operator[]((vec<IntView<0>_> *)(in_RDI + 0x28),local_74);
          local_78 = (int)IntView<0>::getMaxLit((IntView<0> *)in_stack_ffffffffffffff08);
          pLVar5 = vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),local_74);
          pLVar5->x = local_78;
        }
        for (local_7c = 0; uVar3 = local_7c,
            uVar2 = vec<IntView<1>_>::size((vec<IntView<1>_> *)(in_RDI + 0x38)), uVar3 < uVar2;
            local_7c = local_7c + 1) {
          vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_7c);
          local_80 = (int)IntView<1>::getMaxLit((IntView<1> *)in_stack_ffffffffffffff08);
          in_stack_ffffffffffffff20._pt = (Clause *)(in_RDI + 0x78);
          in_stack_ffffffffffffff1c = local_7c;
          uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
          pLVar5 = vec<Lit>::operator[]
                             ((vec<Lit> *)in_stack_ffffffffffffff20._pt,
                              in_stack_ffffffffffffff1c + uVar3);
          pLVar5->x = local_80;
        }
        in_stack_ffffffffffffff10 = (vec<Lit> *)vec<Lit>::operator[]((vec<Lit> *)(in_RDI + 0x78),0);
        in_stack_ffffffffffffff08 = (vec<Lit> *)(in_RDI + 0x78);
        uVar3 = vec<IntView<0>_>::size((vec<IntView<0>_> *)(in_RDI + 0x28));
        pLVar5 = vec<Lit>::operator[](in_stack_ffffffffffffff08,uVar3 + local_5c);
        pLVar5->x = in_stack_ffffffffffffff10->sz;
        pCVar7 = Reason_new<vec<Lit>>(in_stack_ffffffffffffff10);
        Reason::Reason((Reason *)&local_88,pCVar7);
        local_70 = local_88;
      }
      vec<IntView<1>_>::operator[]((vec<IntView<1>_> *)(in_RDI + 0x38),local_5c);
      bVar1 = IntView<1>::setMin((IntView<1> *)
                                 CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
                                 (int64_t)in_stack_ffffffffffffff10,
                                 (Reason)in_stack_ffffffffffffff20,
                                 SUB81((ulong)in_stack_ffffffffffffff08 >> 0x38,0));
      if (!bVar1) {
        return false;
      }
    }
    local_5c = local_5c + 1;
  } while( true );
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}